

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int get_data_cache_size(int cpuid,int level)

{
  int *piVar1;
  __cpu_mask *p_Var2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  FILE *pFVar7;
  size_t sVar8;
  ulong uVar9;
  size_t __cpu;
  ulong uVar10;
  int i;
  long lVar11;
  char *__format;
  int i_1;
  int local_2c4;
  int local_2c0;
  int thread_siblings;
  CpuSet shared_cpu_map;
  int cache_level;
  undefined4 uStack_234;
  pointer piStack_230;
  pointer local_228;
  char path [256];
  
  uVar9 = 0;
  local_2c0 = level;
  do {
    sprintf(path,"/sys/devices/system/cpu/cpu%d/cache/index%d/level",cpuid,uVar9);
    pFVar7 = fopen(path,"rb");
    if (pFVar7 == (FILE *)0x0) {
      return 0;
    }
    _cache_level = (pointer)CONCAT44(uStack_234,0xffffffff);
    iVar5 = __isoc99_fscanf(pFVar7,"%d",&cache_level);
    fclose(pFVar7);
    if ((iVar5 == 1) && (cache_level == local_2c0)) {
      sprintf(path,"/sys/devices/system/cpu/cpu%d/cache/index%d/type",cpuid,uVar9);
      pFVar7 = fopen(path,"rb");
      if (pFVar7 == (FILE *)0x0) {
        return 0;
      }
      iVar5 = __isoc99_fscanf(pFVar7,"%31s",&cache_level);
      fclose(pFVar7);
      if ((iVar5 == 1) &&
         ((iVar5 = bcmp(&cache_level,"Data",5), iVar5 == 0 ||
          (_cache_level == (pointer)0x64656966696e55)))) {
        local_2c4 = 0;
        sprintf(path,"/sys/devices/system/cpu/cpu%d/cache/index%d/size",cpuid,uVar9);
        pFVar7 = fopen(path,"rb");
        if (pFVar7 == (FILE *)0x0) {
          return 0;
        }
        uVar6 = __isoc99_fscanf(pFVar7,"%dK",&local_2c4);
        fclose(pFVar7);
        if (uVar6 == 1) {
          shared_cpu_map.cpu_set.__bits[0xe] = 0;
          shared_cpu_map.cpu_set.__bits[0xf] = 0;
          shared_cpu_map.cpu_set.__bits[0xc] = 0;
          shared_cpu_map.cpu_set.__bits[0xd] = 0;
          shared_cpu_map.cpu_set.__bits[10] = 0;
          shared_cpu_map.cpu_set.__bits[0xb] = 0;
          shared_cpu_map.cpu_set.__bits[8] = 0;
          shared_cpu_map.cpu_set.__bits[9] = 0;
          shared_cpu_map.cpu_set.__bits[6] = 0;
          shared_cpu_map.cpu_set.__bits[7] = 0;
          shared_cpu_map.cpu_set.__bits[4] = 0;
          shared_cpu_map.cpu_set.__bits[5] = 0;
          shared_cpu_map.cpu_set.__bits[2] = 0;
          shared_cpu_map.cpu_set.__bits[3] = 0;
          shared_cpu_map.cpu_set.__bits[0] = 0;
          shared_cpu_map.cpu_set.__bits[1] = 0;
          sprintf(path,"/sys/devices/system/cpu/cpu%d/cache/index%d/shared_cpu_map",cpuid,uVar9);
          pFVar7 = fopen(path,"rb");
          if (pFVar7 == (FILE *)0x0) {
            return 0;
          }
          uVar6 = __isoc99_fscanf(pFVar7,"%255s",&cache_level);
          fclose(pFVar7);
          if (uVar6 == 1) {
            sVar8 = strlen((char *)&cache_level);
            uVar9 = (ulong)((int)sVar8 - 2);
            if (cache_level._1_1_ != 'x' || (char)cache_level != '0') {
              uVar9 = sVar8;
            }
            uVar10 = 0;
            for (uVar9 = uVar9 & 0xffffffff; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
              bVar3 = *(byte *)((long)shared_cpu_map.cpu_set.__bits + uVar9 + 0x7f);
              bVar4 = (byte)uVar10;
              if ((uVar10 < 0x400 & bVar3) == 1) {
                p_Var2 = shared_cpu_map.cpu_set.__bits + (uVar10 >> 6);
                *p_Var2 = *p_Var2 | 1L << (bVar4 & 0x3c);
              }
              if ((bVar3 >> 1 & uVar10 < 0x400) == 1) {
                p_Var2 = shared_cpu_map.cpu_set.__bits + (uVar10 >> 6);
                *p_Var2 = *p_Var2 | 2L << (bVar4 & 0x3c);
              }
              if ((bVar3 >> 2 & uVar10 < 0x400) == 1) {
                p_Var2 = shared_cpu_map.cpu_set.__bits + (uVar10 >> 6);
                *p_Var2 = *p_Var2 | 4L << (bVar4 & 0x3c);
              }
              if ((bVar3 >> 3 & uVar10 < 0x400) == 1) {
                p_Var2 = shared_cpu_map.cpu_set.__bits + (uVar10 >> 6);
                *p_Var2 = *p_Var2 | 8L << (bVar4 & 0x3c);
              }
              uVar10 = uVar10 + 4;
            }
            iVar5 = ncnn::CpuSet::num_enabled(&shared_cpu_map);
            if (iVar5 == 1) {
              return local_2c4 << 10;
            }
            local_228 = (pointer)0x0;
            _cache_level = (pointer)0x0;
            piStack_230 = (pointer)0x0;
            uVar9 = 0;
            iVar5 = 0;
            do {
              if ((long)g_cpucount <= (long)uVar9) {
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          ((_Vector_base<int,_std::allocator<int>_> *)&cache_level);
                return (local_2c4 / iVar5 + 3) / 4 << 0xc;
              }
              if (((uVar9 < 0x400) &&
                  ((shared_cpu_map.cpu_set.__bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)) &&
                 (thread_siblings = get_thread_siblings((int)uVar9), thread_siblings != -1)) {
                lVar11 = 0;
                do {
                  if ((long)piStack_230 - (long)_cache_level >> 2 == lVar11) {
                    std::vector<int,_std::allocator<int>_>::push_back
                              ((vector<int,_std::allocator<int>_> *)&cache_level,&thread_siblings);
                    iVar5 = iVar5 + 1;
                    break;
                  }
                  piVar1 = _cache_level + lVar11;
                  lVar11 = lVar11 + 1;
                } while (*piVar1 != thread_siblings);
              }
              uVar9 = uVar9 + 1;
            } while( true );
          }
          __format = "fscanf shared_cpu_map error %d";
        }
        else {
          __format = "fscanf cache_size_K error %d";
        }
        fprintf(_stderr,__format,(ulong)uVar6);
        fputc(10,_stderr);
        return 0;
      }
    }
    uVar9 = (ulong)((int)uVar9 + 1);
  } while( true );
}

Assistant:

static int get_data_cache_size(int cpuid, int level)
{
    char path[256];

    // discover sysfs cache entry
    int indexid = -1;
    for (int i = 0;; i++)
    {
        // check level
        {
            sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/level", cpuid, i);
            FILE* fp = fopen(path, "rb");
            if (!fp)
                break;

            int cache_level = -1;
            int nscan = fscanf(fp, "%d", &cache_level);
            fclose(fp);
            if (nscan != 1 || cache_level != level)
                continue;
        }

        // check type
        {
            sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/type", cpuid, i);
            FILE* fp = fopen(path, "rb");
            if (!fp)
                break;

            char type[32];
            int nscan = fscanf(fp, "%31s", type);
            fclose(fp);
            if (nscan != 1 || (strcmp(type, "Data") != 0 && strcmp(type, "Unified") != 0))
                continue;
        }

        indexid = i;
        break;
    }

    if (indexid == -1)
    {
        // no sysfs entry
        return 0;
    }

    // get size
    int cache_size_K = 0;
    {
        sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/size", cpuid, indexid);
        FILE* fp = fopen(path, "rb");
        if (!fp)
            return 0;

        int nscan = fscanf(fp, "%dK", &cache_size_K);
        fclose(fp);
        if (nscan != 1)
        {
            NCNN_LOGE("fscanf cache_size_K error %d", nscan);
            return 0;
        }
    }

    // parse shared_cpu_map mask
    ncnn::CpuSet shared_cpu_map;
    {
        sprintf(path, "/sys/devices/system/cpu/cpu%d/cache/index%d/shared_cpu_map", cpuid, indexid);
        FILE* fp = fopen(path, "rb");
        if (!fp)
            return 0;

        char shared_cpu_map_str[256];
        int nscan = fscanf(fp, "%255s", shared_cpu_map_str);
        fclose(fp);
        if (nscan != 1)
        {
            NCNN_LOGE("fscanf shared_cpu_map error %d", nscan);
            return 0;
        }

        int len = strlen(shared_cpu_map_str);

        if (shared_cpu_map_str[0] == '0' && shared_cpu_map_str[1] == 'x')
        {
            // skip leading 0x
            len -= 2;
        }

        int ci = 0;
        for (int i = len - 1; i >= 0; i--)
        {
            char x = shared_cpu_map_str[i];
            if (x & 1) shared_cpu_map.enable(ci + 0);
            if (x & 2) shared_cpu_map.enable(ci + 1);
            if (x & 4) shared_cpu_map.enable(ci + 2);
            if (x & 8) shared_cpu_map.enable(ci + 3);

            ci += 4;
        }
    }

    if (shared_cpu_map.num_enabled() == 1)
        return cache_size_K * 1024;

    // resolve physical cpu count in the shared_cpu_map
    int shared_physical_cpu_count = 0;
    {
        std::vector<int> thread_set;
        for (int i = 0; i < g_cpucount; i++)
        {
            if (!shared_cpu_map.is_enabled(i))
                continue;

            int thread_siblings = get_thread_siblings(i);
            if (thread_siblings == -1)
            {
                // ignore malformed one
                continue;
            }

            bool thread_siblings_exists = false;
            for (size_t j = 0; j < thread_set.size(); j++)
            {
                if (thread_set[j] == thread_siblings)
                {
                    thread_siblings_exists = true;
                    break;
                }
            }

            if (!thread_siblings_exists)
            {
                thread_set.push_back(thread_siblings);
                shared_physical_cpu_count++;
            }
        }
    }

    // return per-physical-core cache size with 4K aligned
    cache_size_K = (cache_size_K / shared_physical_cpu_count + 3) / 4 * 4;

    return cache_size_K * 1024;
}